

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

lys_submodule * yang_read_submodule(lys_module *module,char *data,uint size,unres_schema *unres)

{
  LY_ERR LVar1;
  int iVar2;
  LY_ERR *pLVar3;
  lys_node *local_40;
  lys_node *node;
  lys_submodule *submodule;
  unres_schema *unres_local;
  char *pcStack_20;
  uint size_local;
  char *data_local;
  lys_module *module_local;
  
  local_40 = (lys_node *)0x0;
  submodule = (lys_submodule *)unres;
  unres_local._4_4_ = size;
  pcStack_20 = data;
  data_local = (char *)module;
  node = (lys_node *)calloc(1,0xa8);
  if ((lys_module *)node == (lys_module *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_submodule");
  }
  else {
    ((lys_module *)node)->ctx = *(ly_ctx **)data_local;
    ((lys_module *)node)->field_0x40 = ((lys_module *)node)->field_0x40 & 0xfe | 1;
    ((lys_module *)node)->data = (lys_node *)data_local;
    iVar2 = lyp_check_circmod_add((lys_module *)node);
    if (iVar2 == 0) {
      iVar2 = yang_parse_mem((lys_module *)data_local,(lys_submodule *)node,
                             (unres_schema *)submodule,pcStack_20,unres_local._4_4_,&local_40);
      if (iVar2 == 0) {
        lyp_sort_revisions((lys_module *)node);
        iVar2 = yang_check_sub_module((lys_module *)node,(unres_schema *)submodule,local_40);
        if (iVar2 == 0) {
          lyp_check_circmod_pop(*(ly_ctx **)data_local);
          if ('\x01' < ly_log_level) {
            ly_log(LY_LLVRB,"Submodule \"%s\" successfully parsed.",node->dsc);
          }
          return (lys_submodule *)node;
        }
      }
      else {
        free_yang_common((lys_module *)node,local_40);
      }
    }
  }
  unres_schema_free((lys_module *)node,(unres_schema **)&submodule);
  if ((node == (lys_node *)0x0) || (node->dsc == (char *)0x0)) {
    free(node);
    pLVar3 = ly_errno_location();
    if (*pLVar3 != LY_SUCCESS) {
      pLVar3 = ly_errno_location();
      LVar1 = *pLVar3;
      pLVar3 = ly_errno_location();
      *pLVar3 = LVar1;
    }
    ly_log(LY_LLERR,"Submodule parsing failed.");
  }
  else {
    pLVar3 = ly_errno_location();
    if (*pLVar3 != LY_SUCCESS) {
      pLVar3 = ly_errno_location();
      LVar1 = *pLVar3;
      pLVar3 = ly_errno_location();
      *pLVar3 = LVar1;
    }
    ly_log(LY_LLERR,"Submodule \"%s\" parsing failed.",node->dsc);
    lyp_check_circmod_pop(*(ly_ctx **)data_local);
    lys_sub_module_remove_devs_augs((lys_module *)node);
    lys_submodule_module_data_free((lys_submodule *)node);
    lys_submodule_free((lys_submodule *)node,(_func_void_lys_node_ptr_void_ptr *)0x0);
  }
  return (lys_submodule *)0x0;
}

Assistant:

struct lys_submodule *
yang_read_submodule(struct lys_module *module, const char *data, unsigned int size, struct unres_schema *unres)
{
    struct lys_submodule *submodule;
    struct lys_node *node = NULL;

    submodule = calloc(1, sizeof *submodule);
    if (!submodule) {
        LOGMEM;
        goto error;
    }

    submodule->ctx = module->ctx;
    submodule->type = 1;
    submodule->belongsto = module;

    /* add into the list of processed modules */
    if (lyp_check_circmod_add((struct lys_module *)submodule)) {
        goto error;
    }

    /* module cannot be changed in this case and 1 cannot be returned */
    if (yang_parse_mem(module, submodule, unres, data, size, &node)) {
        free_yang_common((struct lys_module *)submodule, node);
        goto error;
    }

    lyp_sort_revisions((struct lys_module *)submodule);

    if (yang_check_sub_module((struct lys_module *)submodule, unres, node)) {
        goto error;
    }

    lyp_check_circmod_pop(module->ctx);

    LOGVRB("Submodule \"%s\" successfully parsed.", submodule->name);
    return submodule;

error:
    /* cleanup */
    unres_schema_free((struct lys_module *)submodule, &unres);

    if (!submodule || !submodule->name) {
        free(submodule);
        LOGERR(ly_errno, "Submodule parsing failed.");
        return NULL;
    }

    LOGERR(ly_errno, "Submodule \"%s\" parsing failed.", submodule->name);

    lyp_check_circmod_pop(module->ctx);
    lys_sub_module_remove_devs_augs((struct lys_module *)submodule);
    lys_submodule_module_data_free(submodule);
    lys_submodule_free(submodule, NULL);
    return NULL;
}